

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_operate.c
# Opt level: O3

CURLcode append2query(GlobalConfig *global,OperationConfig *config,per_transfer *per,char *q)

{
  CURLUcode CVar1;
  CURLcode CVar2;
  char *in_RAX;
  long lVar3;
  char *updated;
  char *local_38;
  
  local_38 = in_RAX;
  lVar3 = curl_url();
  if (lVar3 == 0) {
    return CURLE_OK;
  }
  CVar1 = curl_url_set(lVar3,0,per->url,0x200);
  if (CVar1 == CURLUE_OK) {
    local_38 = (char *)0x0;
    CVar1 = curl_url_set(lVar3,8,q,0x100);
    if (CVar1 == CURLUE_OK) {
      CVar2 = CURLE_OK;
      CVar1 = curl_url_get(lVar3,0,&local_38,0x200);
      if (CVar1 == CURLUE_OK) {
        free(per->url);
        per->url = local_38;
        goto LAB_00117718;
      }
    }
    CVar2 = urlerr_cvt(CVar1);
  }
  else {
    CVar2 = urlerr_cvt(CVar1);
    errorf(global,"(%d) Could not parse the URL, failed to set query",(ulong)CVar2);
    config->field_0x4ee = config->field_0x4ee | 1;
  }
LAB_00117718:
  curl_url_cleanup(lVar3);
  return CVar2;
}

Assistant:

static CURLcode append2query(struct GlobalConfig *global,
                             struct OperationConfig *config,
                             struct per_transfer *per,
                             const char *q)
{
  CURLcode result = CURLE_OK;
  CURLU *uh = curl_url();
  if(uh) {
    CURLUcode uerr;
    uerr = curl_url_set(uh, CURLUPART_URL, per->url,
                        CURLU_GUESS_SCHEME);
    if(uerr) {
      result = urlerr_cvt(uerr);
      errorf(global, "(%d) Could not parse the URL, "
             "failed to set query", result);
      config->synthetic_error = TRUE;
    }
    else {
      char *updated = NULL;
      uerr = curl_url_set(uh, CURLUPART_QUERY, q, CURLU_APPENDQUERY);
      if(!uerr)
        uerr = curl_url_get(uh, CURLUPART_URL, &updated,
                            CURLU_GUESS_SCHEME);
      if(uerr)
        result = urlerr_cvt(uerr);
      else {
        free(per->url); /* free previous URL */
        per->url = updated; /* use our new URL instead! */
      }
    }
    curl_url_cleanup(uh);
  }
  return result;
}